

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportTable
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  pointer *__ptr;
  undefined1 local_108 [8];
  value_type local_100;
  string_view field_name_local;
  string_view module_name_local;
  string local_b8;
  string local_98;
  ImportType local_78;
  
  field_name_local.size_ = field_name.size_;
  field_name_local.data_ = field_name.data_;
  module_name_local.size_ = module_name.size_;
  module_name_local.data_ = module_name.data_;
  RVar2 = SharedValidator::OnTable
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     elem_type,elem_limits);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    local_100.limits.initial = elem_limits->initial;
    local_100.limits.max = elem_limits->max;
    local_100.limits.has_max = elem_limits->has_max;
    local_100.super_ExternType.kind = Table;
    local_100.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001b2210;
    local_100.super_ExternType._12_4_ = elem_type.enum_;
    local_100.limits.is_shared = elem_limits->is_shared;
    local_100.limits._18_3_ = *(undefined3 *)&elem_limits->field_0x12;
    local_100.limits._21_3_ = SUB43((uint)*(undefined4 *)&elem_limits->field_0x14 >> 8,0);
    if ((local_100.limits.has_max & 1U) == 0) {
      local_100.limits.max = 0xffffffff;
    }
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_98,&module_name_local);
    string_view::to_string_abi_cxx11_(&local_b8,&field_name_local);
    TableType::Clone((TableType *)local_108);
    ImportType::ImportType
              (&local_78,&local_98,&local_b8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_108);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_78);
    ImportType::~ImportType(&local_78);
    if ((tuple<wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>)local_108
        != (_Head_base<0UL,_wabt::interp::ExternType_*,_false>)0x0) {
      (**(code **)(*(_func_int **)local_108 + 8))();
    }
    local_108 = (undefined1  [8])0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,&local_100);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportTable(Index import_index,
                                         string_view module_name,
                                         string_view field_name,
                                         Index table_index,
                                         Type elem_type,
                                         const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(loc, elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), table_type.Clone())});
  table_types_.push_back(table_type);
  return Result::Ok;
}